

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::Document::parseTAGDirective(Document *this)

{
  unsigned_long *puVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  StringRef local_208;
  StringRef local_1f8;
  undefined1 local_1e8 [8];
  StringRef TagPrefix;
  StringRef TagHandle;
  size_t HandleEnd;
  StringRef local_1a0;
  StringRef local_190;
  StringRef local_180;
  undefined1 local_170 [8];
  StringRef T;
  Token Tag;
  Document *this_local;
  unsigned_long local_e0 [2];
  size_type local_d0;
  StringRef *local_c8;
  undefined1 local_c0 [16];
  unsigned_long local_b0;
  char *local_a8;
  undefined1 *local_a0;
  unsigned_long local_98;
  size_type local_90;
  unsigned_long local_88;
  StringRef *local_80;
  undefined1 local_78 [16];
  unsigned_long local_68;
  char *local_60;
  undefined1 *local_58;
  unsigned_long local_50 [2];
  size_type local_40;
  StringRef *local_38;
  undefined1 local_30 [16];
  unsigned_long local_20;
  char *local_18;
  undefined1 *local_10;
  
  getNext((Token *)&T.Length,this);
  local_170 = (undefined1  [8])Tag._0_8_;
  T.Data = Tag.Range.Data;
  strlen(" \t");
  local_40 = StringRef::find_first_of((StringRef *)local_170,local_1a0,0);
  local_50[1] = 0xffffffffffffffff;
  local_38 = (StringRef *)local_170;
  puVar1 = std::min<unsigned_long>(&local_40,(unsigned_long *)&T);
  local_40 = *puVar1;
  pcVar4 = (char *)((long)local_170 + local_40);
  local_50[0] = (long)T.Data - local_40;
  puVar1 = std::min<unsigned_long>(local_50 + 1,local_50);
  local_190.Length = *puVar1;
  local_10 = local_30;
  local_190.Data = pcVar4;
  local_20 = local_190.Length;
  local_18 = pcVar4;
  strlen(" \t");
  local_180 = StringRef::ltrim(&local_190,_HandleEnd);
  local_170 = (undefined1  [8])local_180.Data;
  T.Data = (char *)local_180.Length;
  strlen(" \t");
  sVar2 = StringRef::find_first_of((StringRef *)local_170,stack0xfffffffffffffe38,0);
  local_88 = 0;
  local_90 = sVar2;
  local_80 = (StringRef *)local_170;
  puVar1 = std::min<unsigned_long>(&local_88,(unsigned_long *)&T);
  local_88 = *puVar1;
  pcVar4 = (char *)((long)local_170 + local_88);
  local_98 = (long)T.Data - local_88;
  puVar1 = std::min<unsigned_long>(&local_90,&local_98);
  local_68 = *puVar1;
  local_58 = local_78;
  local_e0[1] = 0xffffffffffffffff;
  TagPrefix.Length = (size_t)pcVar4;
  local_d0 = sVar2;
  local_c8 = (StringRef *)local_170;
  local_60 = pcVar4;
  puVar1 = std::min<unsigned_long>(&local_d0,(unsigned_long *)&T);
  local_d0 = *puVar1;
  pcVar4 = (char *)((long)local_170 + local_d0);
  local_e0[0] = (long)T.Data - local_d0;
  puVar1 = std::min<unsigned_long>(local_e0 + 1,local_e0);
  local_1f8.Length = *puVar1;
  local_a0 = local_c0;
  local_1f8.Data = pcVar4;
  local_b0 = local_1f8.Length;
  local_a8 = pcVar4;
  strlen(" \t");
  _local_1e8 = StringRef::ltrim(&local_1f8,local_208);
  pmVar3 = std::
           map<llvm::StringRef,_llvm::StringRef,_std::less<llvm::StringRef>,_std::allocator<std::pair<const_llvm::StringRef,_llvm::StringRef>_>_>
           ::operator[](&this->TagMap,(key_type *)&TagPrefix.Length);
  pmVar3->Data = (char *)local_1e8;
  pmVar3->Length = (size_t)TagPrefix.Data;
  Token::~Token((Token *)&T.Length);
  return;
}

Assistant:

void Document::parseTAGDirective() {
  Token Tag = getNext(); // %TAG <handle> <prefix>
  StringRef T = Tag.Range;
  // Strip %TAG
  T = T.substr(T.find_first_of(" \t")).ltrim(" \t");
  std::size_t HandleEnd = T.find_first_of(" \t");
  StringRef TagHandle = T.substr(0, HandleEnd);
  StringRef TagPrefix = T.substr(HandleEnd).ltrim(" \t");
  TagMap[TagHandle] = TagPrefix;
}